

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumMixTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumMixTexture *this)

{
  FloatTextureHandle *in_R9;
  
  StringPrintf<pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ SpectrumMixTexture tex1: %s tex2: %s amount: %s ]",
             (char *)this,&this->tex2,(SpectrumTextureHandle *)&this->amount,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumMixTexture::ToString() const {
    return StringPrintf("[ SpectrumMixTexture tex1: %s tex2: %s amount: %s ]", tex1, tex2,
                        amount);
}